

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_>::weight_stadium
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *this,
          PolarExtentCoreContext *ctx,
          PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *position)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  bool bVar5;
  undefined7 extraout_var;
  PolarExtentCoreContext *ctx_00;
  PolarExtentCoreContext *ctx_01;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> in_straight_line_part;
  PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> position_t;
  simd_register<float,_xsimd::fma3<xsimd::avx2>_> sin_angle;
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> local_e0;
  PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> local_c0;
  
  PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_>::transform
            (&local_c0,(PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *)ctx,
             (extent_float_t *)((long)&this[8].super_PolarExtentCore._vptr_PolarExtentCore + 4));
  sin_angle.super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[1] =
       local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[1];
  sin_angle.super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[0] =
       local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[0];
  sin_angle.super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[2] =
       local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[2];
  sin_angle.super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[3] =
       local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[3];
  sin_angle.super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[4] =
       local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[4];
  sin_angle.super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[5] =
       local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[5];
  sin_angle.super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[6] =
       local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[6];
  sin_angle.super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[7] =
       local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[7];
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar6._16_4_ = 0x7fffffff;
  auVar6._20_4_ = 0x7fffffff;
  auVar6._24_4_ = 0x7fffffff;
  auVar6._28_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar6,(undefined1  [32])
                             local_c0.x.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
                             super_simd_register<float,_xsimd::avx2>.
                             super_simd_register<float,_xsimd::avx>.data);
  uVar1 = *(undefined4 *)&this[0xd].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar1;
  auVar9._8_4_ = uVar1;
  auVar9._12_4_ = uVar1;
  auVar9._16_4_ = uVar1;
  auVar9._20_4_ = uVar1;
  auVar9._24_4_ = uVar1;
  auVar9._28_4_ = uVar1;
  fVar2 = *(float *)((long)&this[0xd].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar7._4_4_ = local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
                 super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data
                 [1] * fVar2;
  auVar7._0_4_ = local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
                 super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data
                 [0] * fVar2;
  auVar7._8_4_ = local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
                 super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data
                 [2] * fVar2;
  auVar7._12_4_ =
       local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[3] *
       fVar2;
  auVar7._16_4_ =
       local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[4] *
       fVar2;
  auVar7._20_4_ =
       local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[5] *
       fVar2;
  auVar7._24_4_ =
       local_c0.y.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[6] *
       fVar2;
  auVar7._28_4_ = fVar2;
  auVar3 = vfmadd231ps_fma(auVar7,auVar8,auVar9);
  local_e0.super_get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data =
       (get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>)
       vcmpps_avx(ZEXT432(0) << 0x20,ZEXT1632(auVar3),2);
  auVar7 = vandps_avx(auVar6,(undefined1  [32])
                             local_c0.z.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
                             super_simd_register<float,_xsimd::avx2>.
                             super_simd_register<float,_xsimd::avx>.data);
  weight_from_sin(__return_storage_ptr__,this,ctx_00,
                  (batch)sin_angle.super_simd_register<float,_xsimd::avx2>.
                         super_simd_register<float,_xsimd::avx>.data);
  uVar1 = *(undefined4 *)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  auVar10._16_4_ = uVar1;
  auVar10._20_4_ = uVar1;
  auVar10._24_4_ = uVar1;
  auVar10._28_4_ = uVar1;
  fVar2 = *(float *)((long)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar4._4_4_ = fVar2 * sin_angle.super_simd_register<float,_xsimd::avx2>.
                         super_simd_register<float,_xsimd::avx>.data[1];
  auVar4._0_4_ = fVar2 * sin_angle.super_simd_register<float,_xsimd::avx2>.
                         super_simd_register<float,_xsimd::avx>.data[0];
  auVar4._8_4_ = fVar2 * sin_angle.super_simd_register<float,_xsimd::avx2>.
                         super_simd_register<float,_xsimd::avx>.data[2];
  auVar4._12_4_ =
       fVar2 * sin_angle.super_simd_register<float,_xsimd::avx2>.
               super_simd_register<float,_xsimd::avx>.data[3];
  auVar4._16_4_ =
       fVar2 * sin_angle.super_simd_register<float,_xsimd::avx2>.
               super_simd_register<float,_xsimd::avx>.data[4];
  auVar4._20_4_ =
       fVar2 * sin_angle.super_simd_register<float,_xsimd::avx2>.
               super_simd_register<float,_xsimd::avx>.data[5];
  auVar4._24_4_ =
       fVar2 * sin_angle.super_simd_register<float,_xsimd::avx2>.
               super_simd_register<float,_xsimd::avx>.data[6];
  auVar4._28_4_ = fVar2;
  auVar3 = vfmadd231ps_fma(auVar4,auVar10,auVar8);
  auVar8 = ZEXT1632(auVar3);
  weight_from_cos(__return_storage_ptr__,this,ctx_01,
                  (batch)sin_angle.super_simd_register<float,_xsimd::avx2>.
                         super_simd_register<float,_xsimd::avx>.data);
  bVar5 = xsimd::all<float,xsimd::fma3<xsimd::avx2>>(&local_e0);
  if ((!bVar5) &&
     (((((((((undefined1  [32])
             local_e0.super_get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>.
             super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data >>
             0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           ((undefined1  [32])
            local_e0.super_get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>.
            super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data >>
            0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          ((undefined1  [32])
           local_e0.super_get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>.
           super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data >>
           0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321((undefined1  [32])
                local_e0.super_get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>.
                super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data
                >> 0x7f,0) != '\0') ||
        ((undefined1  [32])
         local_e0.super_get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>.
         super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data &
        (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321((undefined1  [32])
              local_e0.super_get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>.
              super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data >>
              0xbf,0) != '\0') ||
      ((undefined1  [32])
       local_e0.super_get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>.
       super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data &
      (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
      local_e0.super_get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>.
      super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[7]._3_1_ <
      '\0')) {
    vblendvps_avx(auVar8,auVar7,
                  (undefined1  [32])
                  local_e0.super_get_bool_simd_register_t<float,_xsimd::fma3<avx2>_>.
                  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.
                  data);
  }
  return (batch *)CONCAT71(extraout_var,bVar5);
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }